

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# update_segment.cpp
# Opt level: O0

idx_t duckdb::TemplatedUpdateNumericStatistics<unsigned_char>
                (UpdateSegment *segment,SegmentStatistics *stats,UnifiedVectorFormat *update,
                idx_t count,SelectionVector *sel)

{
  bool bVar1;
  idx_t iVar2;
  BaseStatistics *in_RCX;
  UnifiedVectorFormat *in_RDX;
  idx_t idx_1;
  idx_t i_1;
  idx_t not_null_count;
  idx_t idx;
  idx_t i;
  ValidityMask *mask;
  uchar *update_data;
  sel_t *in_stack_ffffffffffffff98;
  uchar new_value;
  BaseStatistics *in_stack_ffffffffffffffa0;
  BaseStatistics *this;
  SelectionVector *in_stack_ffffffffffffffb0;
  BaseStatistics *local_48;
  BaseStatistics *local_8;
  
  UnifiedVectorFormat::GetData<unsigned_char>(in_RDX);
  bVar1 = TemplatedValidityMask<unsigned_long>::AllValid
                    (&(in_RDX->validity).super_TemplatedValidityMask<unsigned_long>);
  if (bVar1) {
    for (local_48 = (BaseStatistics *)0x0; local_48 < in_RCX;
        local_48 = (BaseStatistics *)&(local_48->type).physical_type_) {
      SelectionVector::get_index(in_RDX->sel,(idx_t)local_48);
      BaseStatistics::UpdateNumericStats<unsigned_char>
                (in_stack_ffffffffffffffa0,(uchar)((ulong)in_stack_ffffffffffffff98 >> 0x38));
    }
    SelectionVector::Initialize
              ((SelectionVector *)in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    local_8 = in_RCX;
  }
  else {
    local_8 = (BaseStatistics *)0x0;
    SelectionVector::Initialize(in_stack_ffffffffffffffb0,0);
    for (this = (BaseStatistics *)0x0; this < in_RCX;
        this = (BaseStatistics *)&(this->type).physical_type_) {
      iVar2 = SelectionVector::get_index(in_RDX->sel,(idx_t)this);
      new_value = (uchar)(iVar2 >> 0x38);
      bVar1 = TemplatedValidityMask<unsigned_long>::RowIsValid
                        ((TemplatedValidityMask<unsigned_long> *)local_8,(idx_t)this);
      if (bVar1) {
        local_8 = (BaseStatistics *)&(local_8->type).physical_type_;
        SelectionVector::set_index(in_stack_ffffffffffffffb0,(idx_t)local_8,(idx_t)this);
        BaseStatistics::UpdateNumericStats<unsigned_char>(this,new_value);
      }
    }
  }
  return (idx_t)local_8;
}

Assistant:

idx_t TemplatedUpdateNumericStatistics(UpdateSegment *segment, SegmentStatistics &stats, UnifiedVectorFormat &update,
                                       idx_t count, SelectionVector &sel) {
	auto update_data = update.GetData<T>(update);
	auto &mask = update.validity;

	if (mask.AllValid()) {
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			stats.statistics.UpdateNumericStats<T>(update_data[idx]);
		}
		sel.Initialize(nullptr);
		return count;
	} else {
		idx_t not_null_count = 0;
		sel.Initialize(STANDARD_VECTOR_SIZE);
		for (idx_t i = 0; i < count; i++) {
			auto idx = update.sel->get_index(i);
			if (mask.RowIsValid(idx)) {
				sel.set_index(not_null_count++, i);
				stats.statistics.UpdateNumericStats<T>(update_data[idx]);
			}
		}
		return not_null_count;
	}
}